

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O3

void Assimp::ConvertListToStrings
               (string *in,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  size_t *psVar1;
  byte bVar2;
  _List_node_base *p_Var3;
  Logger *this;
  byte *pbVar4;
  byte *pbVar5;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base local_40;
  
  pbVar4 = (byte *)(in->_M_dataplus)._M_p;
  bVar2 = *pbVar4;
  if (bVar2 != 0) {
LAB_003a9a00:
    do {
      if (bVar2 < 0x28) {
        if ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0) {
          bVar2 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
          goto LAB_003a9a00;
        }
        if ((ulong)bVar2 != 0x27) goto LAB_003a9a43;
        bVar2 = pbVar4[1];
        pbVar5 = pbVar4 + 2;
        while (bVar2 != 0x27) {
          bVar2 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          if (bVar2 == 0) {
            this = DefaultLogger::get();
            Logger::error(this,"ConvertListToString: String list is ill-formatted");
            return;
          }
        }
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pbVar4 + 1,pbVar5 + -1);
        p_Var3 = (_List_node_base *)operator_new(0x30);
        pbVar4 = pbVar5;
      }
      else {
LAB_003a9a43:
        while ((pbVar5 = pbVar4, bVar2 < 0x21 && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
              ) {
          bVar2 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
        }
        while ((0x20 < bVar2 || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
          bVar2 = pbVar5[1];
          pbVar5 = pbVar5 + 1;
        }
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pbVar4,pbVar5);
        p_Var3 = (_List_node_base *)operator_new(0x30);
        pbVar4 = pbVar5;
      }
      p_Var3[1]._M_next = p_Var3 + 2;
      if (local_50 == &local_40) {
        p_Var3[2]._M_next =
             (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
        p_Var3[2]._M_prev = local_40._M_prev;
      }
      else {
        p_Var3[1]._M_next = local_50;
        p_Var3[2]._M_next =
             (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
      }
      p_Var3[1]._M_prev = local_48;
      local_48 = (_List_node_base *)0x0;
      local_40._M_next._0_1_ = 0;
      local_50 = &local_40;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(out->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      bVar2 = *pbVar4;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

void ConvertListToStrings(const std::string& in, std::list<std::string>& out)
{
    const char* s = in.c_str();
    while (*s) {
        SkipSpacesAndLineEnd(&s);
        if (*s == '\'') {
            const char* base = ++s;
            while (*s != '\'') {
                ++s;
                if (*s == '\0') {
                    ASSIMP_LOG_ERROR("ConvertListToString: String list is ill-formatted");
                    return;
                }
            }
            out.push_back(std::string(base,(size_t)(s-base)));
            ++s;
        }
        else {
            out.push_back(GetNextToken(s));
        }
    }
}